

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertions.h
# Opt level: O3

_Deque_iterator<long,_long_&,_long_*> * __thiscall
UnitTests::OutputElement<std::_Deque_iterator<long,long&,long*>>
          (_Deque_iterator<long,_long_&,_long_*> *__return_storage_ptr__,UnitTests *this,ostream *os
          ,_Deque_iterator<long,_long_&,_long_*> *iter,_Deque_iterator<long,_long_&,_long_*> *end)

{
  long lVar1;
  _Elt_pointer plVar2;
  _Map_pointer pplVar3;
  _Elt_pointer plVar4;
  _Elt_pointer plVar5;
  
  if (*(_Elt_pointer *)os == iter->_M_cur) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"##EOF!##",8);
    plVar2 = *(_Elt_pointer *)(os + 8);
    __return_storage_ptr__->_M_cur = *(_Elt_pointer *)os;
    __return_storage_ptr__->_M_first = plVar2;
    pplVar3 = *(_Map_pointer *)(os + 0x18);
    __return_storage_ptr__->_M_last = *(_Elt_pointer *)(os + 0x10);
    __return_storage_ptr__->_M_node = pplVar3;
  }
  else {
    std::ostream::_M_insert<long>((long)this);
    plVar2 = *(_Elt_pointer *)(os + 0x10);
    plVar5 = (_Elt_pointer)(*(long *)os + 8);
    *(_Elt_pointer *)os = plVar5;
    if (plVar5 == plVar2) {
      lVar1 = *(long *)(os + 0x18);
      pplVar3 = (_Map_pointer)(lVar1 + 8);
      *(_Map_pointer *)(os + 0x18) = pplVar3;
      plVar4 = *(_Elt_pointer *)(lVar1 + 8);
      *(_Elt_pointer *)(os + 8) = plVar4;
      plVar2 = plVar4 + 0x40;
      *(_Elt_pointer *)(os + 0x10) = plVar2;
      *(_Elt_pointer *)os = plVar4;
      plVar5 = plVar4;
    }
    else {
      plVar4 = *(_Elt_pointer *)(os + 8);
      pplVar3 = *(_Map_pointer *)(os + 0x18);
    }
    __return_storage_ptr__->_M_cur = plVar5;
    __return_storage_ptr__->_M_first = plVar4;
    __return_storage_ptr__->_M_last = plVar2;
    __return_storage_ptr__->_M_node = pplVar3;
  }
  return __return_storage_ptr__;
}

Assistant:

It OutputElement(std::ostream& os, It iter, It end)
    {
        if (iter != end)
        {
            os << stream(*iter);
            return ++iter;
        }
        os << "##EOF!##";
        return iter;
    }